

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::debug_print(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
              *this,AST_Node *t,string *prepend)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  File_Position *pFVar4;
  AST_Node *t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  reference local_58;
  reference_wrapper<chaiscript::AST_Node> *node;
  iterator __end3;
  iterator __begin3;
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  *__range3;
  string *prepend_local;
  AST_Node *t_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)prepend);
  poVar2 = std::operator<<(poVar2,"(");
  pcVar3 = anon_unknown_443::ast_node_type_to_string(t->identifier);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,") ");
  poVar2 = std::operator<<(poVar2,(string *)&t->text);
  poVar2 = std::operator<<(poVar2," : ");
  pFVar4 = AST_Node::start(t);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pFVar4->line);
  poVar2 = std::operator<<(poVar2,", ");
  pFVar4 = AST_Node::start(t);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pFVar4->column);
  std::operator<<(poVar2,'\n');
  (**t->_vptr_AST_Node)(&__begin3);
  __end3 = std::
           vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
           ::begin((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
                    *)&__begin3);
  node = (reference_wrapper<chaiscript::AST_Node> *)
         std::
         vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
         ::end((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
                *)&__begin3);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                      (&__end3,(__normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                                *)&node);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_58 = __gnu_cxx::
               __normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
               ::operator*(&__end3);
    t_00 = std::reference_wrapper<chaiscript::AST_Node>::get(local_58);
    std::operator+(&local_78,prepend,"  ");
    debug_print(this,t_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
    ::operator++(&__end3);
  }
  std::
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~vector((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
             *)&__begin3);
  return;
}

Assistant:

void debug_print(const AST_Node &t, std::string prepend = "") const override {
        std::cout << prepend << "(" << ast_node_type_to_string(t.identifier) << ") " << t.text << " : " << t.start().line << ", "
                  << t.start().column << '\n';
        for (const auto &node : t.get_children()) {
          debug_print(node.get(), prepend + "  ");
        }
      }